

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O2

uint32_t __thiscall
R10_Decoder::nonZeros_In_Row
          (R10_Decoder *this,
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *Row,uint32_t fromCol,uint32_t toCol)

{
  reference puVar1;
  uint32_t uVar2;
  size_type i;
  
  uVar2 = 0;
  for (i = (size_type)(int)fromCol; (uint)i <= toCol; i = i + 1) {
    puVar1 = boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
             operator[](&Row->data_,i);
    uVar2 = uVar2 + (*puVar1 == '\x01');
  }
  return uVar2;
}

Assistant:

uint32_t R10_Decoder::nonZeros_In_Row(ublas::vector<uint8_t> Row, uint32_t fromCol, uint32_t toCol)
{
	uint32_t r = 0;
	for (int i = fromCol; i <= toCol; i++)
	{
		if (Row(i) == 1)
		{
			r++;
		}
	}

	return r;
}